

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

buffer_ptr_t __thiscall rudp::session::generate_eak(session *this)

{
  bool bVar1;
  uchar uVar2;
  size_t sVar3;
  static_vector<unsigned_char,_2048UL,_void> *this_00;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar4;
  reference puVar5;
  __shared_ptr *p_Var6;
  reference puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  session *in_RSI;
  buffer_ptr_t bVar9;
  vec_iterator<unsigned_char_*,_false> local_68;
  uint local_5c;
  uint i_1;
  uint local_4c;
  undefined1 local_48 [4];
  uint i;
  vec_iterator<unsigned_char_*,_false> local_40;
  vec_iterator<unsigned_char_*,_false> iter;
  undefined1 local_20;
  size_t oos_ack_count;
  session *this_local;
  buffer_ptr_t *buffer;
  
  sVar3 = get_out_of_sequence_acknowlege_count(in_RSI);
  this_00 = (static_vector<unsigned_char,_2048UL,_void> *)operator_new(0x808);
  boost::container::static_vector<unsigned_char,_2048UL,_void>::static_vector(this_00,sVar3 + 6);
  std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>::
  shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>,void>
            ((shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>> *)this,this_00)
  ;
  pvVar4 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  puVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar4,0);
  *puVar5 = '`';
  local_20 = (undefined1)sVar3;
  pvVar4 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  puVar5 = boost::container::
           vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           ::operator[](pvVar4,1);
  *puVar5 = local_20 + '\x06';
  std::
  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
  boost::container::
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ::begin((vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
           *)local_48);
  std::next<boost::container::vec_iterator<unsigned_char*,false>>
            (&local_40,(difference_type)local_48);
  _Var8._M_pi = extraout_RDX;
  for (local_4c = (uint)in_RSI->receive_head; local_4c != 0x100; local_4c = local_4c + 1) {
    p_Var6 = (__shared_ptr *)
             std::
             array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             ::operator[](&in_RSI->receive_buffer,(ulong)local_4c);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
    _Var8._M_pi = extraout_RDX_00;
    if (bVar1) {
      uVar2 = (uchar)local_4c;
      boost::container::vec_iterator<unsigned_char_*,_false>::operator++
                ((vec_iterator<unsigned_char_*,_false> *)&stack0xffffffffffffffa8,(int)&local_40);
      puVar7 = boost::container::vec_iterator<unsigned_char_*,_false>::operator*
                         ((vec_iterator<unsigned_char_*,_false> *)&stack0xffffffffffffffa8);
      *puVar7 = uVar2;
      _Var8._M_pi = extraout_RDX_01;
    }
  }
  for (local_5c = 0; local_5c != in_RSI->receive_head; local_5c = local_5c + 1) {
    p_Var6 = (__shared_ptr *)
             std::
             array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             ::operator[](&in_RSI->receive_buffer,(ulong)local_5c);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var6);
    _Var8._M_pi = extraout_RDX_02;
    if (bVar1) {
      uVar2 = (uchar)local_5c;
      boost::container::vec_iterator<unsigned_char_*,_false>::operator++(&local_68,(int)&local_40);
      puVar7 = boost::container::vec_iterator<unsigned_char_*,_false>::operator*(&local_68);
      *puVar7 = uVar2;
      _Var8._M_pi = extraout_RDX_03;
    }
  }
  bVar9.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var8._M_pi;
  bVar9.
  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (buffer_ptr_t)
         bVar9.
         super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

buffer_ptr_t session::generate_eak() {
    const auto oos_ack_count = get_out_of_sequence_acknowlege_count();
    buffer_ptr_t buffer( new buffer_t( 6 + oos_ack_count ) );
    (*buffer)[ 0 ] = 0x60;
    (*buffer)[ 1 ] = 6 + oos_ack_count;
    auto iter = std::next( buffer->begin(), 4u );
    for( unsigned int i = receive_head; i != 256u; ++i )
      if( receive_buffer[ i ] ) *( iter++ ) = i;
    for( unsigned int i = 0u; i != receive_head; ++i )
      if( receive_buffer[ i ] ) *( iter++ ) = i;
    return buffer;
    out_of_sequence_count = 0;
  }